

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

el_status_t exchange(void)

{
  el_status_t eVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = tty_get();
  iVar2 = rl_point;
  if (iVar3 == -1) {
    eVar1 = CSeof;
  }
  else {
    if (iVar3 == 0x18) {
      if (rl_mark <= rl_end) {
        rl_point = rl_mark;
        rl_mark = iVar2;
        return CSmove;
      }
    }
    else {
      el_ring_bell();
    }
    eVar1 = CSstay;
  }
  return eVar1;
}

Assistant:

static el_status_t exchange(void)
{
    int c;

    if ((c = tty_get()) != CTL('X'))
        return c == EOF ? CSeof : el_ring_bell();

    if ((c = rl_mark) <= rl_end) {
        rl_mark = rl_point;
        rl_point = c;
        return CSmove;
    }

    return CSstay;
}